

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::JoinHashTable::ScanStructure::NextSingleJoin
          (ScanStructure *this,DataChunk *keys,DataChunk *left,DataChunk *result)

{
  idx_t iVar1;
  sel_t *psVar2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  JoinHashTable *pJVar4;
  vector<unsigned_long,_true> *pvVar5;
  idx_t iVar6;
  reference pvVar7;
  reference other;
  const_reference pvVar8;
  InvalidInputException *this_00;
  idx_t iVar9;
  idx_t j;
  idx_t iVar10;
  ulong idx;
  idx_t i;
  ulong uVar11;
  idx_t iVar12;
  allocator local_89;
  SelectionVector *local_88;
  DataChunk *local_80;
  DataChunk *local_78;
  idx_t local_70;
  SelectionVector result_sel;
  string local_50;
  
  local_80 = keys;
  SelectionVector::SelectionVector(&result_sel,0x800);
  local_88 = &this->chain_match_sel_vector;
  iVar10 = 0;
  while (this->count != 0) {
    iVar6 = ResolvePredicates(this,local_80,local_88,&this->chain_no_match_sel_vector);
    iVar1 = this->count;
    psVar2 = (this->chain_match_sel_vector).sel_vector;
    _Var3._M_head_impl =
         (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    for (iVar12 = 0; iVar6 != iVar12; iVar12 = iVar12 + 1) {
      iVar9 = iVar12;
      if (psVar2 != (sel_t *)0x0) {
        iVar9 = (idx_t)psVar2[iVar12];
      }
      _Var3._M_head_impl[iVar9] = true;
      result_sel.sel_vector[iVar10 + iVar12] = (sel_t)iVar9;
    }
    AdvancePointers(this,&this->chain_no_match_sel_vector,iVar1 - iVar6);
    iVar10 = iVar10 + iVar12;
  }
  for (uVar11 = 0;
      uVar11 < (ulong)(((long)(left->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(left->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar11 = uVar11 + 1)
  {
    pvVar7 = vector<duckdb::Vector,_true>::get<true>(&result->data,uVar11);
    other = vector<duckdb::Vector,_true>::get<true>(&left->data,uVar11);
    Vector::Reference(pvVar7,other);
  }
  local_78 = result;
  local_70 = iVar10;
  for (uVar11 = 0; pJVar4 = this->ht, pvVar5 = pJVar4->output_columns,
      uVar11 < (ulong)((long)(pvVar5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3); uVar11 = uVar11 + 1) {
    pvVar7 = vector<duckdb::Vector,_true>::get<true>
                       (&local_78->data,
                        uVar11 + ((long)(left->data).
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(left->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x68);
    for (idx = 0; idx < left->count; idx = idx + 1) {
      if ((this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl[idx] == false) {
        FlatVector::SetNull(pvVar7,idx,true);
      }
    }
    pvVar8 = vector<unsigned_long,_true>::get<true>(this->ht->output_columns,uVar11);
    iVar10 = local_70;
    GatherResult(this,pvVar7,&result_sel,&result_sel,local_70,*pvVar8);
  }
  local_78->count = left->count;
  this->finished = true;
  if ((pJVar4->single_join_error_on_multiple_rows & iVar10 != 0) != 0) {
    AdvancePointers(this,&result_sel,iVar10);
    iVar10 = ResolvePredicates(this,local_80,local_88,(SelectionVector *)0x0);
    if (iVar10 != 0) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 "More than one row returned by a subquery used as an expression - scalar subqueries can only return a single row.\n\nUse \"SET scalar_subquery_error_on_multiple_rows=false\" to revert to previous behavior of returning a random row."
                 ,&local_89);
      InvalidInputException::InvalidInputException(this_00,&local_50);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this->count = 0;
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void ScanStructure::NextSingleJoin(DataChunk &keys, DataChunk &left, DataChunk &result) {
	// single join
	// this join is similar to the semi join except that
	// (1) we actually return data from the RHS and
	// (2) we return NULL for that data if there is no match
	// (3) if single_join_error_on_multiple_rows is set, we need to keep looking for duplicates after fetching
	idx_t result_count = 0;
	SelectionVector result_sel(STANDARD_VECTOR_SIZE);

	while (this->count > 0) {
		// resolve the equality_predicates for the current set of pointers
		idx_t match_count = ResolvePredicates(keys, chain_match_sel_vector, &chain_no_match_sel_vector);
		idx_t no_match_count = this->count - match_count;

		// mark each of the matches as found
		for (idx_t i = 0; i < match_count; i++) {
			// found a match for this index
			auto index = chain_match_sel_vector.get_index(i);
			found_match[index] = true;
			result_sel.set_index(result_count++, index);
		}
		// continue searching for the ones where we did not find a match yet
		AdvancePointers(chain_no_match_sel_vector, no_match_count);
	}
	// reference the columns of the left side from the result
	D_ASSERT(left.ColumnCount() > 0);
	for (idx_t i = 0; i < left.ColumnCount(); i++) {
		result.data[i].Reference(left.data[i]);
	}
	// now fetch the data from the RHS
	for (idx_t i = 0; i < ht.output_columns.size(); i++) {
		auto &vector = result.data[left.ColumnCount() + i];
		// set NULL entries for every entry that was not found
		for (idx_t j = 0; j < left.size(); j++) {
			if (!found_match[j]) {
				FlatVector::SetNull(vector, j, true);
			}
		}
		const auto output_col_idx = ht.output_columns[i];
		D_ASSERT(vector.GetType() == ht.layout_ptr->GetTypes()[output_col_idx]);
		GatherResult(vector, result_sel, result_sel, result_count, output_col_idx);
	}
	result.SetCardinality(left.size());

	// like the SEMI, ANTI and MARK join types, the SINGLE join only ever does one pass over the HT per input chunk
	finished = true;

	if (ht.single_join_error_on_multiple_rows && result_count > 0) {
		// we need to throw an error if there are multiple rows per key
		// advance pointers for those rows
		AdvancePointers(result_sel, result_count);

		// now resolve the predicates
		idx_t match_count = ResolvePredicates(keys, chain_match_sel_vector, nullptr);
		if (match_count > 0) {
			// we found at least one duplicate row - throw
			throw InvalidInputException(
			    "More than one row returned by a subquery used as an expression - scalar subqueries can only "
			    "return a single row.\n\nUse \"SET scalar_subquery_error_on_multiple_rows=false\" to revert to "
			    "previous behavior of returning a random row.");
		}

		this->count = 0;
	}
}